

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * __thiscall
httplib::Request::get_param_value_abi_cxx11_
          (string *__return_storage_ptr__,Request *this,char *key,size_t id)

{
  difference_type __d;
  const_iterator it;
  allocator local_51;
  _Base_ptr local_50;
  key_type local_48;
  
  std::__cxx11::string::string((string *)&local_48,key,&local_51);
  local_50 = (_Base_ptr)
             std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&(this->params)._M_t,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::
  __advance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,long>
            (&local_50,id);
  if ((_Rb_tree_header *)local_50 == &(this->params)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_50 + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Request::get_param_value(const char* key, size_t id) const
{
    auto it = params.find(key);
    std::advance(it, id);
    if (it != params.end()) {
        return it->second;
    }
    return std::string();
}